

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_meta.c
# Opt level: O3

TValue * lj_meta_cat(lua_State *L,TValue *top,int left)

{
  uint uVar1;
  size_t sVar2;
  GCstr *pGVar3;
  char *str;
  cTValue *pcVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  ulong uVar8;
  uint32_t *puVar9;
  int iVar10;
  ulong uVar11;
  ulong uVar12;
  char buf [32];
  char local_58 [40];
  
  uVar8 = (ulong)(uint)-left;
  if (0 < left) {
    uVar8 = (ulong)(uint)left;
  }
  do {
    pcVar4 = top + -1;
    uVar5 = *(uint *)((long)top + -4);
    if (uVar5 >= 0xffff0000 && uVar5 != 0xfffffffb) {
LAB_0010b56b:
      pcVar4 = lj_meta_lookup(L,pcVar4,MM_concat);
      if (((pcVar4->field_2).it == 0xffffffff) &&
         (pcVar4 = lj_meta_lookup(L,top,MM_concat), (pcVar4->field_2).it == 0xffffffff)) {
        lj_err_optype(L,top + ((ulong)(uVar5 < 0xffff0000 || uVar5 == 0xfffffffb) - 1),LJ_ERR_OPCAT)
        ;
      }
      top[1] = top[-1];
      top[2].u32 = *(anon_struct_8_2_f9ee98fb_for_u32 *)top;
      *top = *pcVar4;
      top[-1].n = 3.50588982288949e-320;
      return top + 1;
    }
    if ((top->field_2).it != 0xfffffffb) {
      if (0xfffeffff < (top->field_2).it) goto LAB_0010b56b;
      sVar2 = lj_str_bufnum(local_58,top);
      pGVar3 = lj_str_new(L,local_58,sVar2);
      (top->u32).lo = (uint32_t)pGVar3;
      (top->field_2).it = 0xfffffffb;
    }
    uVar5 = *(uint *)((ulong)(top->u32).lo + 0xc);
    iVar6 = (int)uVar8;
    if (uVar5 == 0) {
      puVar9 = (uint32_t *)((long)top + -4);
      iVar10 = 1;
      if (*puVar9 < 0xffff0000) {
        sVar2 = lj_str_bufnum(local_58,pcVar4);
        pGVar3 = lj_str_new(L,local_58,sVar2);
        (pcVar4->u32).lo = (uint32_t)pGVar3;
        iVar10 = 1;
        goto LAB_0010b539;
      }
    }
    else {
      if (iVar6 < 1) {
        uVar12 = 0;
      }
      else {
        uVar11 = 0;
        do {
          if ((pcVar4->field_2).it == 0xfffffffb) {
            uVar1 = (pcVar4->u32).lo;
          }
          else {
            uVar12 = uVar11;
            if (0xfffeffff < (pcVar4->field_2).it) break;
            sVar2 = lj_str_bufnum(local_58,pcVar4);
            pGVar3 = lj_str_new(L,local_58,sVar2);
            uVar1 = (uint)pGVar3;
            (pcVar4->u32).lo = uVar1;
            (pcVar4->field_2).it = 0xfffffffb;
          }
          if (0x7fffff00 - uVar5 <= *(uint *)((ulong)uVar1 + 0xc)) {
            lj_err_msg(L,LJ_ERR_STROV);
          }
          uVar5 = uVar5 + *(uint *)((ulong)uVar1 + 0xc);
          uVar11 = uVar11 + 1;
          pcVar4 = pcVar4 + -1;
          uVar12 = uVar8;
        } while (uVar8 != uVar11);
      }
      iVar10 = (int)uVar12;
      uVar8 = (ulong)(L->glref).ptr32;
      str = *(char **)(uVar8 + 0x58);
      if (*(uint *)(uVar8 + 100) < uVar5) {
        if (uVar5 < 0x21) {
          uVar5 = 0x20;
        }
        str = (char *)lj_mem_realloc(L,str,*(uint *)(uVar8 + 100),uVar5);
        *(char **)(uVar8 + 0x58) = str;
        *(uint *)(uVar8 + 100) = uVar5;
      }
      iVar7 = iVar10 + 1;
      pcVar4 = top + -(uVar12 & 0xffffffff);
      uVar8 = 0;
      do {
        uVar5 = *(uint *)((ulong)(pcVar4->u32).lo + 0xc);
        memcpy(str + uVar8,(void *)((ulong)(pcVar4->u32).lo + 0x10),(ulong)uVar5);
        uVar8 = (ulong)((int)uVar8 + uVar5);
        iVar7 = iVar7 + -1;
        pcVar4 = pcVar4 + 1;
      } while (0 < iVar7);
      pGVar3 = lj_str_new(L,str,uVar8);
      top[-(long)iVar10].u32.lo = (uint32_t)pGVar3;
      puVar9 = &top[-(long)iVar10].field_2.it;
LAB_0010b539:
      *puVar9 = 0xfffffffb;
    }
    top = top + -(long)iVar10;
    uVar8 = (ulong)(uint)(iVar6 - iVar10);
    if (iVar6 - iVar10 == 0 || iVar6 < iVar10) {
      uVar8 = (ulong)(L->glref).ptr32;
      if (*(uint *)(uVar8 + 0x24) <= *(uint *)(uVar8 + 0x20)) {
        lj_meta_cat_cold_1();
      }
      return (TValue *)0x0;
    }
  } while( true );
}

Assistant:

TValue *lj_meta_cat(lua_State *L, TValue *top, int left)
{
  int fromc = 0;
  if (left < 0) { left = -left; fromc = 1; }
  do {
    int n = 1;
    if (!(tvisstr(top-1) || tvisnumber(top-1)) || !tostring(L, top)) {
      cTValue *mo = lj_meta_lookup(L, top-1, MM_concat);
      if (tvisnil(mo)) {
	mo = lj_meta_lookup(L, top, MM_concat);
	if (tvisnil(mo)) {
	  if (tvisstr(top-1) || tvisnumber(top-1)) top++;
	  lj_err_optype(L, top-1, LJ_ERR_OPCAT);
	  return NULL;  /* unreachable */
	}
      }
      /* One of the top two elements is not a string, call __cat metamethod:
      **
      ** before:    [...][CAT stack .........................]
      **                                 top-1     top         top+1 top+2
      ** pick two:  [...][CAT stack ...] [o1]      [o2]
      ** setup mm:  [...][CAT stack ...] [cont|?]  [mo|tmtype] [o1]  [o2]
      ** in asm:    [...][CAT stack ...] [cont|PC] [mo|delta]  [o1]  [o2]
      **            ^-- func base                              ^-- mm base
      ** after mm:  [...][CAT stack ...] <--push-- [result]
      ** next step: [...][CAT stack .............]
      */
      copyTV(L, top+2, top);  /* Careful with the order of stack copies! */
      copyTV(L, top+1, top-1);
      copyTV(L, top, mo);
      setcont(top-1, lj_cont_cat);
      return top+1;  /* Trigger metamethod call. */
    } else if (strV(top)->len == 0) {  /* Shortcut. */
      (void)tostring(L, top-1);
    } else {
      /* Pick as many strings as possible from the top and concatenate them:
      **
      ** before:    [...][CAT stack ...........................]
      ** pick str:  [...][CAT stack ...] [...... strings ......]
      ** concat:    [...][CAT stack ...] [result]
      ** next step: [...][CAT stack ............]
      */
      MSize tlen = strV(top)->len;
      char *buffer;
      int i;
      for (n = 1; n <= left && tostring(L, top-n); n++) {
	MSize len = strV(top-n)->len;
	if (len >= LJ_MAX_STR - tlen)
	  lj_err_msg(L, LJ_ERR_STROV);
	tlen += len;
      }
      buffer = lj_str_needbuf(L, &G(L)->tmpbuf, tlen);
      n--;
      tlen = 0;
      for (i = n; i >= 0; i--) {
	MSize len = strV(top-i)->len;
	memcpy(buffer + tlen, strVdata(top-i), len);
	tlen += len;
      }
      setstrV(L, top-n, lj_str_new(L, buffer, tlen));
    }
    left -= n;
    top -= n;
  } while (left >= 1);
  if (LJ_UNLIKELY(G(L)->gc.total >= G(L)->gc.threshold)) {
    if (!fromc) L->top = curr_topL(L);
    lj_gc_step(L);
  }
  return NULL;
}